

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test8(void)

{
  int iVar1;
  bool bVar2;
  int c;
  queue<int> b;
  queue<int> a;
  
  srand(0);
  CP::queue<int>::queue(&a);
  CP::queue<int>::queue(&b);
  iVar1 = 200;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = rand();
    CP::queue<int>::push(&a,&c);
  }
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = rand();
    CP::queue<int>::push(&b,&c);
  }
  iVar1 = 900;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = rand();
    CP::queue<int>::push(&a,&c);
    CP::queue<int>::push(&b,&c);
  }
  iVar1 = 100;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = rand();
    CP::queue<int>::push(&a,&c);
  }
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = rand();
    CP::queue<int>::push(&b,&c);
  }
  iVar1 = 200;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    CP::queue<int>::pop(&a);
  }
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    CP::queue<int>::pop(&b);
  }
  bVar2 = CP::queue<int>::operator==(&a,&b);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar2 = CP::queue<int>::operator==(&b,&a);
    bVar2 = !bVar2;
  }
  CP::queue<int>::~queue(&b);
  CP::queue<int>::~queue(&a);
  return bVar2;
}

Assistant:

bool test8() {
  srand(0);
  CP::queue<int> a,b;
  int f1 = 200;
  int f2 = 10;
  int same = 900;
  int b1 = 100;
  int b2 = 10;
  for (int i = 0;i < f1;i++) a.push(rand());
  for (int i = 0;i < f2;i++) b.push(rand());
  for (int i = 0;i < same;i++) {
    int c = rand();
    a.push(c);
    b.push(c);
  }
  for (int i = 0;i < b1;i++) a.push(rand());
  for (int i = 0;i < b2;i++) b.push(rand());
  for (int i = 0;i < f1;i++) a.pop();
  for (int i = 0;i < f2;i++) b.pop();
  return ( ((a == b) == false)  && ((b == a) == false));
}